

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall minibag::View::iterator::~iterator(iterator *this)

{
  long in_RDI;
  vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_> *unaff_retaddr;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(void **)(in_RDI + 0x28) != (void *)0x0)) {
    operator_delete(*(void **)(in_RDI + 0x28),0x28);
  }
  std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::~vector
            (unaff_retaddr);
  return;
}

Assistant:

View::iterator::~iterator()
{
  if (message_instance_ != NULL)
    delete message_instance_;
}